

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O1

int ON_UuidPair::Compare(ON_UuidPair *a,ON_UuidPair *b)

{
  int iVar1;
  
  if (a == (ON_UuidPair *)0x0) {
    iVar1 = -(uint)(b != (ON_UuidPair *)0x0);
  }
  else if (b == (ON_UuidPair *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = ON_UuidCompare(a->m_uuid,b->m_uuid);
    if (iVar1 == 0) {
      iVar1 = ON_UuidCompare(a->m_uuid + 1,b->m_uuid + 1);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int ON_UuidPair::Compare(const class ON_UuidPair* a,const class ON_UuidPair* b)
{
  int i;
  if (!a)
  {
    return (b) ? -1 : 0;
  }
  if (!b)
  {
    return 1;
  }
  if ( 0 == (i = ON_UuidCompare(a->m_uuid[0],b->m_uuid[0])) )
  {
    i = ON_UuidCompare(a->m_uuid[1],b->m_uuid[1]);
  }
  return i;
}